

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O3

void dsdKernelCopyListPlusOneMinusOne
               (Dsd_Node_t *p,Dsd_Node_t *First,Dsd_Node_t **ppList,int nListSize,int iSkipped)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (p->nDecs == nListSize) {
    *p->pDecs = First;
    if (0 < nListSize) {
      iVar1 = 1;
      uVar2 = 0;
      do {
        if ((uint)iSkipped != uVar2) {
          lVar3 = (long)iVar1;
          iVar1 = iVar1 + 1;
          p->pDecs[lVar3] = ppList[uVar2];
        }
        uVar2 = uVar2 + 1;
      } while ((uint)nListSize != uVar2);
    }
    return;
  }
  __assert_fail("nListSize == p->nDecs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdProc.c"
                ,0x605,
                "void dsdKernelCopyListPlusOneMinusOne(Dsd_Node_t *, Dsd_Node_t *, Dsd_Node_t **, int, int)"
               );
}

Assistant:

void dsdKernelCopyListPlusOneMinusOne( Dsd_Node_t * p, Dsd_Node_t * First, Dsd_Node_t ** ppList, int nListSize, int iSkipped )
{
    int i, Counter;
    assert( nListSize == p->nDecs );
    p->pDecs[0] = First;
    for( i = 0, Counter = 1; i < nListSize; i++ )
        if ( i != iSkipped )
            p->pDecs[Counter++] = ppList[i];
}